

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv__fs_close(int fd)

{
  int *piVar1;
  int local_10;
  int rc;
  int fd_local;
  
  local_10 = uv__close_nocancel(fd);
  if ((local_10 == -1) &&
     ((piVar1 = __errno_location(), *piVar1 == 4 || (piVar1 = __errno_location(), *piVar1 == 0x73)))
     ) {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

static int uv__fs_close(int fd) {
  int rc;

  rc = uv__close_nocancel(fd);
  if (rc == -1)
    if (errno == EINTR || errno == EINPROGRESS)
      rc = 0;  /* The close is in progress, not an error. */

  return rc;
}